

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

bool __thiscall testing::internal::FilePath::FileOrDirectoryExists(FilePath *this)

{
  int iVar1;
  StatStruct file_stat;
  stat local_90;
  
  iVar1 = stat((this->pathname_)._M_dataplus._M_p,&local_90);
  return iVar1 == 0;
}

Assistant:

bool FilePath::FileOrDirectoryExists() const {
#if GTEST_OS_WINDOWS_MOBILE
  LPCWSTR unicode = String::AnsiToUtf16(pathname_.c_str());
  const DWORD attributes = GetFileAttributes(unicode);
  delete [] unicode;
  return attributes != kInvalidFileAttributes;
#else
  posix::StatStruct file_stat;
  return posix::Stat(pathname_.c_str(), &file_stat) == 0;
#endif  // GTEST_OS_WINDOWS_MOBILE
}